

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

void sysbvm_dwarf_debugInfo_attribute_textAddress
               (sysbvm_dwarf_debugInfo_builder_t *builder,uintptr_t attribute,uintptr_t value)

{
  size_t sVar1;
  undefined4 local_24;
  uintptr_t uStack_20;
  uint32_t addressOffset;
  uintptr_t value_local;
  uintptr_t attribute_local;
  sysbvm_dwarf_debugInfo_builder_t *builder_local;
  
  uStack_20 = value;
  value_local = attribute;
  attribute_local = (uintptr_t)builder;
  sysbvm_dwarf_encodeULEB128(&builder->abbrev,attribute);
  sysbvm_dwarf_encodeULEB128((sysbvm_dynarray_t *)(attribute_local + 0xa0),1);
  sVar1 = sysbvm_dwarf_encodePointer((sysbvm_dynarray_t *)(attribute_local + 0xc0),uStack_20);
  local_24 = (undefined4)sVar1;
  sysbvm_dynarray_add((sysbvm_dynarray_t *)(attribute_local + 0x100),&local_24);
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_debugInfo_attribute_textAddress(sysbvm_dwarf_debugInfo_builder_t *builder, uintptr_t attribute, uintptr_t value)
{
    sysbvm_dwarf_encodeULEB128(&builder->abbrev, attribute);
    sysbvm_dwarf_encodeULEB128(&builder->abbrev, DW_FORM_addr);

    uint32_t addressOffset = (uint32_t)sysbvm_dwarf_encodePointer(&builder->info, value);
    sysbvm_dynarray_add(&builder->infoTextAddresses, &addressOffset);
}